

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.h
# Opt level: O0

PageBitVector * __thiscall
Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetUnAllocatedPages
          (PageBitVector *__return_storage_ptr__,
          PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this)

{
  PageBitVector *unallocPages;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this_local;
  
  memcpy(__return_storage_ptr__,&this->freePages,0x28);
  BVStatic<272UL>::Or(__return_storage_ptr__,&this->decommitPages);
  return __return_storage_ptr__;
}

Assistant:

PageBitVector GetUnAllocatedPages() const
    {
        PageBitVector unallocPages = freePages;
        unallocPages.Or(&decommitPages);
        return unallocPages;
    }